

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateReduceLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  uint32 uVar1;
  bool bVar2;
  Type *pTVar3;
  ReduceLayerParams *pRVar4;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  Result r;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  Result::Result(&r);
  validateInputCount((Result *)&err,layer,1,1);
  Result::operator=(&r,(Result *)&err);
  std::__cxx11::string::~string((string *)&err._M_string_length);
  bVar2 = Result::good(&r);
  if (bVar2) {
    validateOutputCount((Result *)&err,layer,1,1);
    Result::operator=(&r,(Result *)&err);
    std::__cxx11::string::~string((string *)&err._M_string_length);
  }
  if ((this->ndArrayInterpretation != true) ||
     ((layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1)) {
LAB_00592549:
    Result::Result(__return_storage_ptr__,&r);
    goto LAB_00592556;
  }
  std::__cxx11::string::string((string *)&local_48,"Reduce",(allocator *)&local_68);
  validateInputOutputRankEquality((Result *)&err,layer,&local_48,&this->blobNameToRank);
  Result::operator=(&r,(Result *)&err);
  std::__cxx11::string::~string((string *)&err._M_string_length);
  std::__cxx11::string::~string((string *)&local_48);
  bVar2 = Result::good(&r);
  if (!bVar2) goto LAB_00592549;
  pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::TypeHandler>
                     (&(layer->inputtensor_).super_RepeatedPtrFieldBase,0);
  uVar1 = pTVar3->rank_;
  err._M_dataplus._M_p = (pointer)&err.field_2;
  err._M_string_length = 0;
  err.field_2._M_local_buf[0] = '\0';
  pRVar4 = Specification::NeuralNetworkLayer::reduce(layer);
  switch(pRVar4->axis_) {
  case 0:
    if (2 < (int)uVar1) {
LAB_00592541:
      std::__cxx11::string::~string((string *)&err);
      goto LAB_00592549;
    }
    break;
  case 1:
    if (1 < (int)uVar1) goto LAB_00592541;
    break;
  case 2:
  case 3:
  case 4:
    if (0 < (int)uVar1) goto LAB_00592541;
    break;
  default:
    if (pRVar4->axis_ != 0x7fffffff) goto LAB_00592541;
    std::__cxx11::string::string((string *)&local_d0,(string *)(layer->name_).ptr_);
    std::operator+(&local_b0,"Reduce layer: \'",&local_d0);
    std::operator+(&local_68,&local_b0,"\': unknown value for parameter \'axis\'.");
    goto LAB_005924f1;
  }
  std::__cxx11::string::string((string *)&local_d0,(string *)(layer->name_).ptr_);
  std::operator+(&local_b0,"Reduce layer \'",&local_d0);
  std::operator+(&local_68,&local_b0,
                 "\': input\'s rank is smaller than the dimensions provided in the axis parameter");
LAB_005924f1:
  std::__cxx11::string::operator=((string *)&err,(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
  std::__cxx11::string::~string((string *)&err);
LAB_00592556:
  std::__cxx11::string::~string((string *)&r.m_message);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateReduceLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }

    if (ndArrayInterpretation && layer.inputtensor_size() > 0) {
        r = validateInputOutputRankEquality(layer, "Reduce", blobNameToRank);
        if (!r.good()) {return r;}
        int rank = static_cast<int>(layer.inputtensor(0).rank());
        bool sufficientInputRank = true;
        std::string err;

        switch (layer.reduce().axis()) {
            case Specification::ReduceLayerParams::CHW:
                if (rank < 3) {sufficientInputRank = false;}
                break;
            case Specification::ReduceLayerParams::HW:
                if (rank < 2) {sufficientInputRank = false;}
                break;
            case Specification::ReduceLayerParams::H:
                if (rank < 1) {sufficientInputRank = false;}
                break;
            case Specification::ReduceLayerParams::W:
                if (rank < 1) {sufficientInputRank = false;}
                break;
            case Specification::ReduceLayerParams::C:
                if (rank < 1) {sufficientInputRank = false;}
                break;
            case CoreML::Specification::ReduceLayerParams_ReduceAxis_ReduceLayerParams_ReduceAxis_INT_MIN_SENTINEL_DO_NOT_USE_:
            case CoreML::Specification::ReduceLayerParams_ReduceAxis_ReduceLayerParams_ReduceAxis_INT_MAX_SENTINEL_DO_NOT_USE_:
                err = "Reduce layer: '" + std::string(layer.name()) + "': unknown value for parameter 'axis'.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
        if (!sufficientInputRank) {
            err = "Reduce layer '" + std::string(layer.name()) + "': input's rank is smaller than the dimensions provided in the axis parameter";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    return r;
}